

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckFuncTypeVar(Validator *this,Var *var,FuncType **out_func_type)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  const_reference ppFVar3;
  uint local_2c;
  FuncType **ppFStack_28;
  Index index;
  FuncType **out_func_type_local;
  Var *var_local;
  Validator *this_local;
  
  ppFStack_28 = out_func_type;
  out_func_type_local = (FuncType **)var;
  var_local = (Var *)this;
  sVar2 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::size
                    (&this->current_module_->func_types);
  result = CheckVar(this,(Index)sVar2,(Var *)out_func_type_local,"function type",&local_2c);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (ppFStack_28 != (FuncType **)0x0) {
      ppFVar3 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::operator[]
                          (&this->current_module_->func_types,(ulong)local_2c);
      *ppFStack_28 = *ppFVar3;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckFuncTypeVar(const Var* var,
                                   const FuncType** out_func_type) {
  Index index;
  CHECK_RESULT(CheckVar(current_module_->func_types.size(), var,
                        "function type", &index));
  if (out_func_type) {
    *out_func_type = current_module_->func_types[index];
  }
  return Result::Ok;
}